

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O3

int32_t __thiscall
icu_63::TimeZoneFormat::parseOffsetFieldsWithPattern
          (TimeZoneFormat *this,UnicodeString *text,int32_t start,UVector *patternItems,
          UBool forceSingleHourDigit,int32_t *hour,int32_t *min,int32_t *sec)

{
  short sVar1;
  bool bVar2;
  UBool UVar3;
  int8_t iVar4;
  int32_t length;
  int iVar5;
  UChar32 c;
  void *pvVar6;
  int32_t iVar7;
  int index;
  uint uVar8;
  UChar *s;
  int32_t local_60;
  int32_t local_5c;
  int32_t local_58;
  int32_t local_54;
  int32_t local_50;
  uint local_4c;
  int32_t *local_48;
  TimeZoneFormat *local_40;
  UnicodeString *local_38;
  
  local_50 = start;
  local_48 = hour;
  if (patternItems->count < 1) {
    local_58 = 0;
    local_5c = 0;
    local_54 = 0;
  }
  else {
    local_54 = 0;
    local_4c = (uint)(byte)((forceSingleHourDigit == '\0') + 1);
    local_5c = 0;
    local_58 = 0;
    index = 0;
    local_40 = this;
    local_38 = text;
    do {
      local_60 = 0;
      pvVar6 = UVector::elementAt(patternItems,index);
      switch(*(undefined4 *)((long)pvVar6 + 0x10)) {
      case 0:
        s = *(UChar **)((long)pvVar6 + 8);
        length = u_strlen_63(s);
        if (index == 0) {
          sVar1 = (text->fUnion).fStackFields.fLengthAndFlags;
          if (sVar1 < 0) {
            iVar5 = (text->fUnion).fFields.fLength;
          }
          else {
            iVar5 = (int)sVar1 >> 5;
          }
          if (start < iVar5) {
            c = UnicodeString::char32At(text,start);
            UVar3 = PatternProps::isWhiteSpace(c);
            if ((UVar3 == '\0') && (iVar7 = length, 0 < length)) {
              do {
                uVar8 = (uint)(ushort)*s;
                if (((uVar8 & 0xf800) == 0xd800) &&
                   (((((ushort)*s >> 10 & 1) == 0 && (iVar7 != 1)) &&
                    (((ushort)s[1] & 0xfc00) == 0xdc00)))) {
                  uVar8 = uVar8 * 0x400 + (uint)(ushort)s[1] + 0xfca02400;
                }
                UVar3 = PatternProps::isWhiteSpace(uVar8);
                length = iVar7;
                if (UVar3 == '\0') break;
                uVar8 = 2 - (uVar8 < 0x10000);
                s = s + uVar8;
                length = iVar7 - uVar8;
                bVar2 = (int)uVar8 <= iVar7;
                iVar7 = length;
              } while (length != 0 && bVar2);
            }
          }
        }
        text = local_38;
        iVar4 = UnicodeString::doCaseCompare(local_38,start,length,s,0,length,0);
        this = local_40;
        if (iVar4 != '\0') goto switchD_001f7d8b_caseD_3;
        goto LAB_001f7f10;
      case 1:
        local_54 = parseOffsetFieldWithLocalizedDigits
                             (this,text,start,'\x01',(uint8_t)local_4c,0,0x17,&local_60);
        break;
      case 2:
        local_5c = parseOffsetFieldWithLocalizedDigits
                             (this,text,start,'\x02','\x02',0,0x3b,&local_60);
        break;
      default:
        goto switchD_001f7d8b_caseD_3;
      case 4:
        local_58 = parseOffsetFieldWithLocalizedDigits
                             (this,text,start,'\x02','\x02',0,0x3b,&local_60);
      }
      length = local_60;
      if (local_60 == 0) {
switchD_001f7d8b_caseD_3:
        *sec = 0;
        *min = 0;
        *local_48 = 0;
        return 0;
      }
LAB_001f7f10:
      start = start + length;
      index = index + 1;
    } while (index < patternItems->count);
  }
  *local_48 = local_54;
  *min = local_5c;
  *sec = local_58;
  return start - local_50;
}

Assistant:

int32_t
TimeZoneFormat::parseOffsetFieldsWithPattern(const UnicodeString& text, int32_t start,
        UVector* patternItems, UBool forceSingleHourDigit, int32_t& hour, int32_t& min, int32_t& sec) const {
    UBool failed = FALSE;
    int32_t offsetH, offsetM, offsetS;
    offsetH = offsetM = offsetS = 0;
    int32_t idx = start;

    for (int32_t i = 0; i < patternItems->size(); i++) {
        int32_t len = 0;
        const GMTOffsetField* field = (const GMTOffsetField*)patternItems->elementAt(i);
        GMTOffsetField::FieldType fieldType = field->getType();
        if (fieldType == GMTOffsetField::TEXT) {
            const UChar* patStr = field->getPatternText();
            len = u_strlen(patStr);
            if (i == 0) {
                // When TimeZoneFormat parse() is called from SimpleDateFormat,
                // leading space characters might be truncated. If the first pattern text
                // starts with such character (e.g. Bidi control), then we need to
                // skip the leading space charcters.
                if (idx < text.length() && !PatternProps::isWhiteSpace(text.char32At(idx))) {
                    while (len > 0) {
                        UChar32 ch;
                        int32_t chLen;
                        U16_GET(patStr, 0, 0, len, ch)
                        if (PatternProps::isWhiteSpace(ch)) {
                            chLen = U16_LENGTH(ch);
                            len -= chLen;
                            patStr += chLen;
                        }
                        else {
                            break;
                        }
                    }
                }
            }
            if (text.caseCompare(idx, len, patStr, 0) != 0) {
                failed = TRUE;
                break;
            }
            idx += len;
        } else {
            if (fieldType == GMTOffsetField::HOUR) {
                uint8_t maxDigits = forceSingleHourDigit ? 1 : 2;
                offsetH = parseOffsetFieldWithLocalizedDigits(text, idx, 1, maxDigits, 0, MAX_OFFSET_HOUR, len);
            } else if (fieldType == GMTOffsetField::MINUTE) {
                offsetM = parseOffsetFieldWithLocalizedDigits(text, idx, 2, 2, 0, MAX_OFFSET_MINUTE, len);
            } else if (fieldType == GMTOffsetField::SECOND) {
                offsetS = parseOffsetFieldWithLocalizedDigits(text, idx, 2, 2, 0, MAX_OFFSET_SECOND, len);
            }

            if (len == 0) {
                failed = TRUE;
                break;
            }
            idx += len;
        }
    }

    if (failed) {
        hour = min = sec = 0;
        return 0;
    }

    hour = offsetH;
    min = offsetM;
    sec = offsetS;

    return idx - start;
}